

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_alternating(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  double absolute_tolerance;
  double *in_stack_fffffffffffffc88;
  double local_360;
  value_type local_358;
  value_type local_350;
  double local_340;
  value_type local_338;
  value_type local_330;
  double local_320;
  value_type local_318;
  value_type local_310;
  double local_300;
  value_type local_2f8;
  value_type local_2f0;
  double local_2e0;
  value_type local_2d8;
  value_type local_2d0;
  double local_2c0;
  value_type local_2b8;
  value_type local_2b0;
  double local_2a0;
  value_type local_298;
  value_type local_290;
  double local_280;
  value_type local_278;
  value_type local_270;
  double local_260;
  value_type local_258;
  value_type local_250;
  double local_240;
  value_type local_238;
  value_type local_230;
  double local_220;
  value_type local_218;
  value_type local_210;
  double local_200;
  value_type local_1f8;
  value_type local_1f0;
  double local_1e0;
  value_type local_1d8;
  value_type local_1d0;
  double local_1c0;
  value_type local_1b8;
  value_type local_1b0;
  double local_1a0;
  value_type local_198;
  value_type local_190;
  double local_180;
  value_type local_178;
  value_type local_170;
  double local_160;
  value_type local_158;
  value_type local_150;
  double local_140;
  value_type local_138;
  value_type local_130;
  double local_120;
  value_type local_118;
  value_type local_110;
  double local_100;
  value_type local_f8;
  value_type local_f0;
  double local_e0;
  value_type local_d8;
  value_type local_d0;
  double local_c0;
  value_type local_b8;
  value_type local_b0;
  double local_a0;
  value_type local_98;
  value_type local_90;
  double local_80;
  value_type local_78;
  value_type local_70;
  double local_60;
  value_type local_58;
  value_type local_50;
  double local_40;
  value_type local_38;
  undefined1 local_30 [8];
  moment<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_30,0.125);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_38 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_40 = 1.0;
  local_50 = filter.sum.mean;
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x3c,0x11154d,(char *)&local_38,&local_40,in_stack_fffffffffffffc88,
             predicate_24);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_58 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_60 = 1.53333;
  local_70 = filter.sum.mean;
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x3e,0x11154d,(char *)&local_58,&local_60,in_stack_fffffffffffffc88,
             predicate_23);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_78 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_80 = 1.33136;
  local_90 = filter.sum.mean;
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.33136","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x40,0x11154d,(char *)&local_78,&local_80,in_stack_fffffffffffffc88,
             predicate_22);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_98 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_a0 = 1.53333;
  local_b0 = filter.sum.mean;
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x42,0x11154d,(char *)&local_98,&local_a0,in_stack_fffffffffffffc88,
             predicate_21);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_b8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_c0 = 1.39647;
  local_d0 = filter.sum.mean;
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.39647","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x44,0x11154d,(char *)&local_b8,&local_c0,in_stack_fffffffffffffc88,
             predicate_20);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_d8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_e0 = 1.53333;
  local_f0 = filter.sum.mean;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x46,0x11154d,(char *)&local_d8,&local_e0,in_stack_fffffffffffffc88,
             predicate_19);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_f8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_100 = 1.42356;
  local_110 = filter.sum.mean;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.42356","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x48,0x11154d,(char *)&local_f8,&local_100,in_stack_fffffffffffffc88,
             predicate_18);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_118 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_120 = 1.53333;
  local_130 = filter.sum.mean;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x4a,0x11154d,(char *)&local_118,&local_120,in_stack_fffffffffffffc88,
             predicate_17);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_138 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_140 = 1.43801;
  local_150 = filter.sum.mean;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.43801","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x4c,0x11154d,(char *)&local_138,&local_140,in_stack_fffffffffffffc88,
             predicate_16);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_158 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_160 = 1.53333;
  local_170 = filter.sum.mean;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x4e,0x11154d,(char *)&local_158,&local_160,in_stack_fffffffffffffc88,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_178 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_180 = 1.44673;
  local_190 = filter.sum.mean;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.44673","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x50,0x11154d,(char *)&local_178,&local_180,in_stack_fffffffffffffc88,
             predicate_14);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_198 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_1a0 = 1.53333;
  local_1b0 = filter.sum.mean;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x52,0x11154d,(char *)&local_198,&local_1a0,in_stack_fffffffffffffc88,
             predicate_13);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_1b8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_1c0 = 1.4524;
  local_1d0 = filter.sum.mean;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.4524","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x54,0x11154d,(char *)&local_1b8,&local_1c0,in_stack_fffffffffffffc88,
             predicate_12);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_1d8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_1e0 = 1.53333;
  local_1f0 = filter.sum.mean;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x56,0x11154d,(char *)&local_1d8,&local_1e0,in_stack_fffffffffffffc88,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_1f8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_200 = 1.45627;
  local_210 = filter.sum.mean;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.45627","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x58,0x11154d,(char *)&local_1f8,&local_200,in_stack_fffffffffffffc88,
             predicate_10);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_218 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_220 = 1.53333;
  local_230 = filter.sum.mean;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x5a,0x11154d,(char *)&local_218,&local_220,in_stack_fffffffffffffc88,
             predicate_09);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_238 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_240 = 1.45899;
  local_250 = filter.sum.mean;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.45899","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x5c,0x11154d,(char *)&local_238,&local_240,in_stack_fffffffffffffc88,
             predicate_08);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_258 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_260 = 1.53333;
  local_270 = filter.sum.mean;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x5e,0x11154d,(char *)&local_258,&local_260,in_stack_fffffffffffffc88,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_278 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_280 = 1.46094;
  local_290 = filter.sum.mean;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.46094","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x60,0x11154d,(char *)&local_278,&local_280,in_stack_fffffffffffffc88,
             predicate_06);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_298 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_2a0 = 1.53333;
  local_2b0 = filter.sum.mean;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x62,0x11154d,(char *)&local_298,&local_2a0,in_stack_fffffffffffffc88,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1000.0);
  local_2b8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_2c0 = 134.387;
  local_2d0 = filter.sum.mean;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","134.387","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x67,0x11154d,(char *)&local_2b8,&local_2c0,in_stack_fffffffffffffc88,
             predicate_04);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_2d8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_2e0 = 116.913;
  local_2f0 = filter.sum.mean;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","116.913","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x6c,0x11154d,(char *)&local_2d8,&local_2e0,in_stack_fffffffffffffc88,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_2f8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_300 = 101.719;
  local_310 = filter.sum.mean;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","101.719","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x6e,0x11154d,(char *)&local_2f8,&local_300,in_stack_fffffffffffffc88,
             predicate_02);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_318 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_320 = 88.7272;
  local_330 = filter.sum.mean;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","88.7272","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x70,0x11154d,(char *)&local_318,&local_320,in_stack_fffffffffffffc88,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,1.0);
  local_338 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_340 = 77.3577;
  local_350 = filter.sum.mean;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","77.3577","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x72,0x11154d,(char *)&local_338,&local_340,in_stack_fffffffffffffc88,
             predicate_00);
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::push
            ((basic_moment<double,_(trial::online::with)1> *)local_30,2.0);
  local_358 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_30);
  local_360 = 67.636;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.mean;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","67.636","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x74,0x11154d,(char *)&local_358,&local_360,in_stack_fffffffffffffc88,
             predicate);
  return;
}

Assistant:

void test_alternating()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    // Convergence towards 1.5

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.33136, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.39647, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.42356, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.43801, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.44673, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.4524, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.45627, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.45899, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.46094, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);

    // Outlier

    filter.push(1000.0);
    TRIAL_TEST_WITH(filter.mean(), 134.387, tolerance);

    // Slow recovery

    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 116.913, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 101.719, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 88.7272, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 77.3577, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 67.636, tolerance);
}